

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Loop.H
# Opt level: O0

void amrex::
     LoopConcurrentOnCpu<amrex::CellConservativeLinear::interp(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::RunOn)::__0>
               (Box *bx,anon_class_176_6_7011cc79 *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Long LVar5;
  anon_class_176_6_7011cc79 *in_RDI;
  int i;
  int j;
  int k;
  Dim3 hi;
  Dim3 lo;
  int local_104;
  int local_100;
  int local_fc;
  int in_stack_fffffffffffffff0;
  int i_00;
  anon_class_176_6_7011cc79 *this;
  
  i_00 = 0;
  iVar1 = *(int *)&(in_RDI->tmp).p;
  iVar2 = *(int *)((long)&(in_RDI->tmp).p + 4);
  iVar3 = *(int *)((long)&(in_RDI->tmp).jstride + 4);
  LVar5 = (in_RDI->tmp).kstride;
  iVar4 = *(int *)((long)&(in_RDI->tmp).kstride + 4);
  this = in_RDI;
  for (local_fc = (int)(in_RDI->tmp).jstride; local_100 = iVar2, local_fc <= iVar4;
      local_fc = local_fc + 1) {
    for (; local_104 = iVar1, local_100 <= (int)LVar5; local_100 = local_100 + 1) {
      for (; local_104 <= iVar3; local_104 = local_104 + 1) {
        CellConservativeLinear::interp::anon_class_176_6_7011cc79::operator()
                  (this,i_00,in_stack_fffffffffffffff0,(int)((ulong)in_RDI >> 0x20));
      }
    }
  }
  return;
}

Assistant:

void LoopConcurrentOnCpu (Box const& bx, F&& f) noexcept
{
    const auto lo = amrex::lbound(bx);
    const auto hi = amrex::ubound(bx);
    for (int k = lo.z; k <= hi.z; ++k) {
    for (int j = lo.y; j <= hi.y; ++j) {
    AMREX_PRAGMA_SIMD
    for (int i = lo.x; i <= hi.x; ++i) {
        f(i,j,k);
    }}}
}